

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_dec_ref_base_pic_marking(nal_t *nal,bs_t *b)

{
  uint32_t uVar1;
  bs_t *b_local;
  nal_t *nal_local;
  
  uVar1 = bs_read_u1(b);
  nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag = uVar1 != 0;
  if ((nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag & 1U) != 0) {
    do {
      uVar1 = bs_read_ue(b);
      nal->prefix_nal_svc->memory_management_base_control_operation = uVar1;
      if (nal->prefix_nal_svc->memory_management_base_control_operation == 1) {
        uVar1 = bs_read_ue(b);
        nal->prefix_nal_svc->difference_of_base_pic_nums_minus1 = uVar1;
      }
      if (nal->prefix_nal_svc->memory_management_base_control_operation == 2) {
        uVar1 = bs_read_ue(b);
        nal->prefix_nal_svc->long_term_base_pic_num = uVar1;
      }
    } while (nal->prefix_nal_svc->memory_management_base_control_operation != 0);
  }
  return;
}

Assistant:

void read_dec_ref_base_pic_marking(nal_t* nal, bs_t* b)
{
    nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag = bs_read_u1(b);
    if( nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag )
    {
        do {
            nal->prefix_nal_svc->memory_management_base_control_operation = bs_read_ue(b);
            
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 1 )
            {
                nal->prefix_nal_svc->difference_of_base_pic_nums_minus1 = bs_read_ue(b);
            }
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 2 )
            {
                nal->prefix_nal_svc->long_term_base_pic_num = bs_read_ue(b);
            }
        } while( nal->prefix_nal_svc->memory_management_base_control_operation != 0 );
    }
}